

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O0

btScalar gjkepa2_impl::GJK::projectorigin(btVector3 *a,btVector3 *b,btVector3 *c,btScalar *w,U *m)

{
  float *in_RCX;
  int *in_R8;
  btScalar bVar1;
  btVector3 p;
  btScalar s;
  btScalar d;
  btScalar subd;
  U j;
  U i;
  U subm;
  btScalar subw [2];
  btScalar mindist;
  btScalar l;
  btVector3 n;
  btVector3 dl [3];
  btVector3 *vt [3];
  btVector3 *in_stack_fffffffffffffea8;
  btVector3 *v2;
  btVector3 *in_stack_fffffffffffffeb0;
  btVector3 *v1;
  btVector3 *in_stack_fffffffffffffeb8;
  btVector3 *v2_00;
  btVector3 *in_stack_fffffffffffffec0;
  int local_134;
  int local_12c;
  U *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  btVector3 *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  btVector3 local_d0;
  btScalar local_c0;
  btScalar local_bc;
  btScalar local_b8;
  uint local_b4;
  btScalar local_b0 [4];
  uint local_a0;
  uint local_9c;
  float local_98;
  float local_94;
  float local_90;
  btScalar local_8c;
  btVector3 local_88;
  btScalar local_78 [4];
  btVector3 local_68;
  btVector3 local_58 [2];
  int *local_30;
  float *local_28;
  btScalar local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_78 = (btScalar  [4])operator-(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_68 = operator-(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_58[0] = operator-(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_88 = btCross(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_8c = btVector3::length2((btVector3 *)0x1e76a2);
  if (local_8c <= 0.0) {
    local_4 = -1.0;
  }
  else {
    local_90 = -1.0;
    memset(&local_98,0,8);
    local_9c = 0;
    for (local_a0 = 0; local_a0 < 3; local_a0 = local_a0 + 1) {
      local_b0 = (btScalar  [4])btCross(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      bVar1 = btDot(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      if (0.0 < bVar1) {
        local_b4 = projectorigin::imd3[local_a0];
        local_b8 = projectorigin((btVector3 *)
                                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                 in_stack_ffffffffffffff00,
                                 (btScalar *)
                                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                 in_stack_fffffffffffffef0);
        if ((local_90 < 0.0) || (local_b8 < local_90)) {
          if ((local_9c & 1) == 0) {
            local_12c = 0;
          }
          else {
            local_12c = 1 << ((byte)local_a0 & 0x1f);
          }
          if ((local_9c & 2) == 0) {
            local_134 = 0;
          }
          else {
            local_134 = 1 << ((byte)local_b4 & 0x1f);
          }
          *local_30 = local_12c + local_134;
          local_28[local_a0] = local_98;
          local_28[local_b4] = local_94;
          local_28[projectorigin::imd3[local_b4]] = 0.0;
          local_90 = local_b8;
        }
      }
    }
    if (local_90 < 0.0) {
      v2 = &local_88;
      local_bc = btDot(in_stack_fffffffffffffeb0,v2);
      local_c0 = btSqrt(0.0);
      local_d0 = ::operator*(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8->m_floats);
      v2_00 = &local_d0;
      local_90 = btVector3::length2((btVector3 *)0x1e797d);
      *local_30 = 7;
      v1 = &local_68;
      operator-(in_stack_fffffffffffffec0,v2_00);
      btCross(v1,v2);
      bVar1 = btVector3::length((btVector3 *)0x1e79e4);
      *local_28 = bVar1 / local_c0;
      operator-(local_58,v2_00);
      btCross(v1,v2);
      bVar1 = btVector3::length((btVector3 *)0x1e7a4d);
      local_28[1] = bVar1 / local_c0;
      local_28[2] = 1.0 - (*local_28 + local_28[1]);
    }
    local_4 = local_90;
  }
  return local_4;
}

Assistant:

static btScalar		projectorigin(	const btVector3& a,
				const btVector3& b,
				const btVector3& c,
				btScalar* w,U& m)
			{
				static const U		imd3[]={1,2,0};
				const btVector3*	vt[]={&a,&b,&c};
				const btVector3		dl[]={a-b,b-c,c-a};
				const btVector3		n=btCross(dl[0],dl[1]);
				const btScalar		l=n.length2();
				if(l>GJK_SIMPLEX3_EPS)
				{
					btScalar	mindist=-1;
					btScalar	subw[2]={0.f,0.f};
					U			subm(0);
					for(U i=0;i<3;++i)
					{
						if(btDot(*vt[i],btCross(dl[i],n))>0)
						{
							const U			j=imd3[i];
							const btScalar	subd(projectorigin(*vt[i],*vt[j],subw,subm));
							if((mindist<0)||(subd<mindist))
							{
								mindist		=	subd;
								m			=	static_cast<U>(((subm&1)?1<<i:0)+((subm&2)?1<<j:0));
								w[i]		=	subw[0];
								w[j]		=	subw[1];
								w[imd3[j]]	=	0;				
							}
						}
					}
					if(mindist<0)
					{
						const btScalar	d=btDot(a,n);	
						const btScalar	s=btSqrt(l);
						const btVector3	p=n*(d/l);
						mindist	=	p.length2();
						m		=	7;
						w[0]	=	(btCross(dl[1],b-p)).length()/s;
						w[1]	=	(btCross(dl[2],c-p)).length()/s;
						w[2]	=	1-(w[0]+w[1]);
					}
					return(mindist);
				}
				return(-1);
			}